

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O2

void Sfm_DecMarkMffc(Abc_Obj_t *pPivot,int nLevelMin,int nMffcMax,int fVeryVerbose,Vec_Int_t *vMffc,
                    Vec_Int_t *vInMffc,Sfm_Tim_t *pTim,Sfm_Mit_t *pMit)

{
  long *plVar1;
  long *plVar2;
  Abc_Obj_t *p;
  Abc_Ntk_t *pAVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  Abc_Obj_t *pAVar7;
  Abc_Obj_t *pAVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  
  if (nMffcMax < 1) {
    __assert_fail("nMffcMax > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                  ,0x5b3,
                  "void Sfm_DecMarkMffc(Abc_Obj_t *, int, int, int, Vec_Int_t *, Vec_Int_t *, Sfm_Tim_t *, Sfm_Mit_t *)"
                 );
  }
  Vec_IntFill(vMffc,1,pPivot->Id);
  if (pMit == (Sfm_Mit_t *)0x0) {
    if (pTim == (Sfm_Tim_t *)0x0) {
      for (lVar9 = 0; uVar6 = (ulong)(pPivot->vFanins).nSize, lVar9 < (long)uVar6; lVar9 = lVar9 + 1
          ) {
        pAVar7 = (Abc_Obj_t *)pPivot->pNtk->vObjs->pArray[(pPivot->vFanins).pArray[lVar9]];
        iVar4 = Sfm_DecNodeIsMffc(pAVar7,nLevelMin);
        if ((iVar4 != 0) && (vMffc->nSize < nMffcMax)) {
          Vec_IntPushUnique(vMffc,pAVar7->Id);
        }
      }
      for (lVar9 = 0; lVar9 < (int)uVar6; lVar9 = lVar9 + 1) {
        pAVar7 = (Abc_Obj_t *)pPivot->pNtk->vObjs->pArray[(pPivot->vFanins).pArray[lVar9]];
        iVar4 = Sfm_DecNodeIsMffc(pAVar7,nLevelMin);
        if ((iVar4 != 0) && (vMffc->nSize < nMffcMax)) {
          for (lVar10 = 0; lVar10 < (pAVar7->vFanins).nSize; lVar10 = lVar10 + 1) {
            pAVar8 = (Abc_Obj_t *)pAVar7->pNtk->vObjs->pArray[(pAVar7->vFanins).pArray[lVar10]];
            iVar4 = Sfm_DecNodeIsMffc(pAVar8,nLevelMin);
            if ((iVar4 != 0) && (vMffc->nSize < nMffcMax)) {
              Vec_IntPushUnique(vMffc,pAVar8->Id);
            }
          }
        }
        uVar6 = (ulong)(uint)(pPivot->vFanins).nSize;
      }
      for (lVar9 = 0; lVar9 < (int)uVar6; lVar9 = lVar9 + 1) {
        pAVar7 = (Abc_Obj_t *)pPivot->pNtk->vObjs->pArray[(pPivot->vFanins).pArray[lVar9]];
        iVar4 = Sfm_DecNodeIsMffc(pAVar7,nLevelMin);
        if ((iVar4 != 0) && (vMffc->nSize < nMffcMax)) {
          for (lVar10 = 0; lVar10 < (pAVar7->vFanins).nSize; lVar10 = lVar10 + 1) {
            pAVar8 = (Abc_Obj_t *)pAVar7->pNtk->vObjs->pArray[(pAVar7->vFanins).pArray[lVar10]];
            iVar4 = Sfm_DecNodeIsMffc(pAVar8,nLevelMin);
            if ((iVar4 != 0) && (vMffc->nSize < nMffcMax)) {
              for (lVar11 = 0; lVar11 < (pAVar8->vFanins).nSize; lVar11 = lVar11 + 1) {
                p = (Abc_Obj_t *)pAVar8->pNtk->vObjs->pArray[(pAVar8->vFanins).pArray[lVar11]];
                iVar4 = Sfm_DecNodeIsMffc(p,nLevelMin);
                if ((iVar4 != 0) && (vMffc->nSize < nMffcMax)) {
                  Vec_IntPushUnique(vMffc,p->Id);
                }
              }
            }
          }
        }
        uVar6 = (ulong)(uint)(pPivot->vFanins).nSize;
      }
      iVar4 = vMffc->nSize;
      if (nMffcMax < iVar4) {
        __assert_fail("Vec_IntSize(vMffc) <= nMffcMax",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                      ,0x5fb,
                      "void Sfm_DecMarkMffc(Abc_Obj_t *, int, int, int, Vec_Int_t *, Vec_Int_t *, Sfm_Tim_t *, Sfm_Mit_t *)"
                     );
      }
      for (iVar5 = 0; iVar5 < iVar4; iVar5 = iVar5 + 1) {
        pAVar3 = pPivot->pNtk;
        iVar4 = Vec_IntEntry(vMffc,iVar5);
        pAVar7 = Abc_NtkObj(pAVar3,iVar4);
        if (pAVar7 != (Abc_Obj_t *)0x0) {
          *(byte *)&pAVar7->field_6 = *(byte *)&pAVar7->field_6 | 8;
        }
        iVar4 = vMffc->nSize;
      }
      *(byte *)&pPivot->field_6 = *(byte *)&pPivot->field_6 | 0x10;
      vInMffc->nSize = 0;
      for (iVar4 = 0; iVar4 < vMffc->nSize; iVar4 = iVar4 + 1) {
        pAVar3 = pPivot->pNtk;
        iVar5 = Vec_IntEntry(vMffc,iVar4);
        pAVar7 = Abc_NtkObj(pAVar3,iVar5);
        if (pAVar7 != (Abc_Obj_t *)0x0) {
          for (lVar9 = 0; lVar9 < (pAVar7->vFanins).nSize; lVar9 = lVar9 + 1) {
            pAVar8 = (Abc_Obj_t *)pAVar7->pNtk->vObjs->pArray[(pAVar7->vFanins).pArray[lVar9]];
            iVar5 = Abc_NodeIsTravIdCurrent(pAVar8);
            if ((iVar5 != 0) && ((pAVar8->field_6).iTemp == 1)) {
              Vec_IntPushUnique(vInMffc,pAVar8->Id);
            }
          }
        }
      }
    }
    else {
      *(byte *)&pPivot->field_6 = *(byte *)&pPivot->field_6 | 0x18;
      vInMffc->nSize = 0;
      lVar9 = 0;
      while( true ) {
        uVar6 = (ulong)(pPivot->vFanins).nSize;
        iVar4 = (int)pTim;
        if ((long)uVar6 <= lVar9) break;
        pAVar8 = (Abc_Obj_t *)(long)(pPivot->vFanins).pArray[lVar9];
        pAVar7 = (Abc_Obj_t *)pPivot->pNtk->vObjs->pArray[(long)pAVar8];
        iVar4 = Sfm_DecNodeIsMffcInput(pAVar7,iVar4,(Sfm_Tim_t *)pPivot,pAVar8);
        if (iVar4 != 0) {
          Vec_IntPushUnique(vInMffc,pAVar7->Id);
        }
        lVar9 = lVar9 + 1;
      }
      for (lVar9 = 0; lVar9 < (int)uVar6; lVar9 = lVar9 + 1) {
        plVar1 = (long *)pPivot->pNtk->vObjs->pArray[(pPivot->vFanins).pArray[lVar9]];
        for (lVar10 = 0; lVar10 < *(int *)((long)plVar1 + 0x1c); lVar10 = lVar10 + 1) {
          pAVar8 = (Abc_Obj_t *)(long)*(int *)(plVar1[4] + lVar10 * 4);
          pAVar7 = *(Abc_Obj_t **)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) + (long)pAVar8 * 8);
          iVar5 = Sfm_DecNodeIsMffcInput(pAVar7,iVar4,(Sfm_Tim_t *)pPivot,pAVar8);
          if (iVar5 != 0) {
            Vec_IntPushUnique(vInMffc,pAVar7->Id);
          }
        }
        uVar6 = (ulong)(uint)(pPivot->vFanins).nSize;
      }
      for (lVar9 = 0; lVar9 < (int)uVar6; lVar9 = lVar9 + 1) {
        plVar1 = (long *)pPivot->pNtk->vObjs->pArray[(pPivot->vFanins).pArray[lVar9]];
        for (lVar10 = 0; lVar10 < *(int *)((long)plVar1 + 0x1c); lVar10 = lVar10 + 1) {
          plVar2 = *(long **)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                             (long)*(int *)(plVar1[4] + lVar10 * 4) * 8);
          for (lVar11 = 0; lVar11 < *(int *)((long)plVar2 + 0x1c); lVar11 = lVar11 + 1) {
            pAVar8 = (Abc_Obj_t *)(long)*(int *)(plVar2[4] + lVar11 * 4);
            pAVar7 = *(Abc_Obj_t **)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)pAVar8 * 8);
            iVar5 = Sfm_DecNodeIsMffcInput(pAVar7,iVar4,(Sfm_Tim_t *)pPivot,pAVar8);
            if (iVar5 != 0) {
              Vec_IntPushUnique(vInMffc,pAVar7->Id);
            }
          }
        }
        uVar6 = (ulong)(uint)(pPivot->vFanins).nSize;
      }
    }
  }
  else {
    *(byte *)&pPivot->field_6 = *(byte *)&pPivot->field_6 | 0x18;
    vInMffc->nSize = 0;
    lVar9 = 0;
    while( true ) {
      uVar6 = (ulong)(pPivot->vFanins).nSize;
      iVar4 = (int)pMit;
      if ((long)uVar6 <= lVar9) break;
      pAVar8 = (Abc_Obj_t *)(long)(pPivot->vFanins).pArray[lVar9];
      pAVar7 = (Abc_Obj_t *)pPivot->pNtk->vObjs->pArray[(long)pAVar8];
      iVar4 = Sfm_DecNodeIsMffcInput2(pAVar7,iVar4,(Sfm_Mit_t *)pPivot,pAVar8);
      if (iVar4 != 0) {
        Vec_IntPushUnique(vInMffc,pAVar7->Id);
      }
      lVar9 = lVar9 + 1;
    }
    for (lVar9 = 0; lVar9 < (int)uVar6; lVar9 = lVar9 + 1) {
      plVar1 = (long *)pPivot->pNtk->vObjs->pArray[(pPivot->vFanins).pArray[lVar9]];
      for (lVar10 = 0; lVar10 < *(int *)((long)plVar1 + 0x1c); lVar10 = lVar10 + 1) {
        pAVar8 = (Abc_Obj_t *)(long)*(int *)(plVar1[4] + lVar10 * 4);
        pAVar7 = *(Abc_Obj_t **)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) + (long)pAVar8 * 8);
        iVar5 = Sfm_DecNodeIsMffcInput2(pAVar7,iVar4,(Sfm_Mit_t *)pPivot,pAVar8);
        if (iVar5 != 0) {
          Vec_IntPushUnique(vInMffc,pAVar7->Id);
        }
      }
      uVar6 = (ulong)(uint)(pPivot->vFanins).nSize;
    }
    for (lVar9 = 0; lVar9 < (int)uVar6; lVar9 = lVar9 + 1) {
      plVar1 = (long *)pPivot->pNtk->vObjs->pArray[(pPivot->vFanins).pArray[lVar9]];
      for (lVar10 = 0; lVar10 < *(int *)((long)plVar1 + 0x1c); lVar10 = lVar10 + 1) {
        plVar2 = *(long **)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                           (long)*(int *)(plVar1[4] + lVar10 * 4) * 8);
        for (lVar11 = 0; lVar11 < *(int *)((long)plVar2 + 0x1c); lVar11 = lVar11 + 1) {
          pAVar8 = (Abc_Obj_t *)(long)*(int *)(plVar2[4] + lVar11 * 4);
          pAVar7 = *(Abc_Obj_t **)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)pAVar8 * 8);
          iVar5 = Sfm_DecNodeIsMffcInput2(pAVar7,iVar4,(Sfm_Mit_t *)pPivot,pAVar8);
          if (iVar5 != 0) {
            Vec_IntPushUnique(vInMffc,pAVar7->Id);
          }
        }
      }
      uVar6 = (ulong)(uint)(pPivot->vFanins).nSize;
    }
  }
  return;
}

Assistant:

void Sfm_DecMarkMffc( Abc_Obj_t * pPivot, int nLevelMin, int nMffcMax, int fVeryVerbose, Vec_Int_t * vMffc, Vec_Int_t * vInMffc, Sfm_Tim_t * pTim, Sfm_Mit_t * pMit )
{
    Abc_Obj_t * pFanin, * pFanin2, * pFanin3, * pObj; int i, k, n;
    assert( nMffcMax > 0 );
    Vec_IntFill( vMffc, 1, Abc_ObjId(pPivot) );
    if ( pMit != NULL )
    {
        pPivot->iTemp |= SFM_MASK_MFFC;
        pPivot->iTemp |= SFM_MASK_PIVOT;
        // collect MFFC inputs (these are low-delay nodes close to the pivot)
        Vec_IntClear(vInMffc);
        Abc_ObjForEachFanin( pPivot, pFanin, i )
            if ( Sfm_DecNodeIsMffcInput2(pFanin, nLevelMin, pMit, pPivot) )
                Vec_IntPushUnique( vInMffc, Abc_ObjId(pFanin) );
        Abc_ObjForEachFanin( pPivot, pFanin, i )
            Abc_ObjForEachFanin( pFanin, pFanin2, k )
                if ( Sfm_DecNodeIsMffcInput2(pFanin2, nLevelMin, pMit, pPivot) )
                    Vec_IntPushUnique( vInMffc, Abc_ObjId(pFanin2) );
        Abc_ObjForEachFanin( pPivot, pFanin, i )
            Abc_ObjForEachFanin( pFanin, pFanin2, k )
                Abc_ObjForEachFanin( pFanin2, pFanin3, n )
                    if ( Sfm_DecNodeIsMffcInput2(pFanin3, nLevelMin, pMit, pPivot) )
                        Vec_IntPushUnique( vInMffc, Abc_ObjId(pFanin3) );
    }
    else if ( pTim != NULL )
    {
        pPivot->iTemp |= SFM_MASK_MFFC;
        pPivot->iTemp |= SFM_MASK_PIVOT;
        // collect MFFC inputs (these are low-delay nodes close to the pivot)
        Vec_IntClear(vInMffc);
        Abc_ObjForEachFanin( pPivot, pFanin, i )
            if ( Sfm_DecNodeIsMffcInput(pFanin, nLevelMin, pTim, pPivot) )
                Vec_IntPushUnique( vInMffc, Abc_ObjId(pFanin) );
        Abc_ObjForEachFanin( pPivot, pFanin, i )
            Abc_ObjForEachFanin( pFanin, pFanin2, k )
                if ( Sfm_DecNodeIsMffcInput(pFanin2, nLevelMin, pTim, pPivot) )
                    Vec_IntPushUnique( vInMffc, Abc_ObjId(pFanin2) );
        Abc_ObjForEachFanin( pPivot, pFanin, i )
            Abc_ObjForEachFanin( pFanin, pFanin2, k )
                Abc_ObjForEachFanin( pFanin2, pFanin3, n )
                    if ( Sfm_DecNodeIsMffcInput(pFanin3, nLevelMin, pTim, pPivot) )
                        Vec_IntPushUnique( vInMffc, Abc_ObjId(pFanin3) );

/*
        printf( "Node %d: (%.2f)  ", pPivot->Id, Scl_Int2Flt(Sfm_ManReadObjDelay(p, Abc_ObjId(pPivot)))  );
        Abc_ObjForEachFanin( pPivot, pFanin, i )
            printf( "%d: %.2f  ", Abc_ObjLevel(pFanin), Scl_Int2Flt(Sfm_ManReadObjDelay(p, Abc_ObjId(pFanin))) );
        printf( "\n" );

        printf( "Node %d: ", pPivot->Id );
        Abc_NtkForEachObjVec( vInMffc, pPivot->pNtk, pObj, i )
            printf( "%d: %.2f  ", Abc_ObjLevel(pObj), Scl_Int2Flt(Sfm_ManReadObjDelay(p, Abc_ObjId(pObj))) );
        printf( "\n" );
*/
    }
    else
    {

        // collect MFFC
        Abc_ObjForEachFanin( pPivot, pFanin, i )
            if ( Sfm_DecNodeIsMffc(pFanin, nLevelMin) && Vec_IntSize(vMffc) < nMffcMax )
                Vec_IntPushUnique( vMffc, Abc_ObjId(pFanin) );
        Abc_ObjForEachFanin( pPivot, pFanin, i )
            if ( Sfm_DecNodeIsMffc(pFanin, nLevelMin) && Vec_IntSize(vMffc) < nMffcMax )
                Abc_ObjForEachFanin( pFanin, pFanin2, k )
                    if ( Sfm_DecNodeIsMffc(pFanin2, nLevelMin) && Vec_IntSize(vMffc) < nMffcMax )
                        Vec_IntPushUnique( vMffc, Abc_ObjId(pFanin2) );
        Abc_ObjForEachFanin( pPivot, pFanin, i )
            if ( Sfm_DecNodeIsMffc(pFanin, nLevelMin) && Vec_IntSize(vMffc) < nMffcMax )
                Abc_ObjForEachFanin( pFanin, pFanin2, k )
                    if ( Sfm_DecNodeIsMffc(pFanin2, nLevelMin) && Vec_IntSize(vMffc) < nMffcMax )
                        Abc_ObjForEachFanin( pFanin2, pFanin3, n )
                            if ( Sfm_DecNodeIsMffc(pFanin3, nLevelMin) && Vec_IntSize(vMffc) < nMffcMax )
                                Vec_IntPushUnique( vMffc, Abc_ObjId(pFanin3) );
        // mark MFFC
        assert( Vec_IntSize(vMffc) <= nMffcMax );
        Abc_NtkForEachObjVec( vMffc, pPivot->pNtk, pObj, i )
            pObj->iTemp |= SFM_MASK_MFFC;
        pPivot->iTemp |= SFM_MASK_PIVOT;
        // collect MFFC inputs
        Vec_IntClear(vInMffc);
        Abc_NtkForEachObjVec( vMffc, pPivot->pNtk, pObj, i )
            Abc_ObjForEachFanin( pObj, pFanin, k )
                if ( Abc_NodeIsTravIdCurrent(pFanin) && pFanin->iTemp == SFM_MASK_PI )
                    Vec_IntPushUnique( vInMffc, Abc_ObjId(pFanin) );

//        printf( "Node %d: ", pPivot->Id );
//        Abc_ObjForEachFanin( pPivot, pFanin, i )
//            printf( "%d ", Abc_ObjFanoutNum(pFanin) );
//        printf( "\n" );

//        Abc_NtkForEachObjVec( vInMffc, pPivot->pNtk, pObj, i )
//            printf( "%d ", Abc_ObjFanoutNum(pObj) );
//        printf( "\n" );

    }
}